

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::PrefixedExpr(SQCompiler *this)

{
  long lVar1;
  bool bVar2;
  SQCompiler *pSVar3;
  SQCompiler *in_RDI;
  SQObject SVar4;
  SQInteger ttarget;
  SQInteger closure;
  SQInteger table;
  SQInteger key;
  SQInteger tmp2;
  SQInteger tmp1;
  SQInteger src;
  SQInteger diff;
  SQInteger pos;
  SQCompiler *in_stack_00000128;
  SQCompiler *in_stack_ffffffffffffff30;
  SQCompiler *in_stack_ffffffffffffff38;
  SQFuncState *in_stack_ffffffffffffff40;
  SQFuncState *in_stack_ffffffffffffff48;
  long in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  SQOpcode SVar5;
  SQCompiler *in_stack_ffffffffffffff60;
  SQFuncState *in_stack_ffffffffffffff90;
  SQObjectType in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SQObjectValue in_stack_ffffffffffffffd8;
  
  pSVar3 = (SQCompiler *)Factor(in_stack_00000128);
  while( true ) {
    while( true ) {
      while( true ) {
        SVar5 = (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        lVar1 = in_RDI->_token;
        if (lVar1 != 0x28) break;
        in_stack_ffffffffffffff50 = (in_RDI->_es).etype;
        if (in_stack_ffffffffffffff50 == 2) {
          SQFuncState::PopTarget(in_stack_ffffffffffffff40);
          SQFuncState::PopTarget(in_stack_ffffffffffffff40);
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff90 =
               (SQFuncState *)
               SQFuncState::PushTarget
                         ((SQFuncState *)in_stack_ffffffffffffff38,
                          (SQInteger)in_stack_ffffffffffffff30);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff60,
                     (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50,
                     (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                     (SQInteger)in_stack_ffffffffffffff38);
        }
        else if (in_stack_ffffffffffffff50 == 3) {
          in_stack_ffffffffffffff48 = in_RDI->_fs;
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff60,
                     (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50,
                     (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                     (SQInteger)in_stack_ffffffffffffff38);
        }
        else if (in_stack_ffffffffffffff50 == 5) {
          in_stack_ffffffffffffff38 = (SQCompiler *)in_RDI->_fs;
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff60,
                     (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50,
                     (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                     (SQInteger)in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff40 = in_RDI->_fs;
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff60,
                     (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50,
                     (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                     (SQInteger)in_stack_ffffffffffffff38);
        }
        else {
          in_stack_ffffffffffffff30 = (SQCompiler *)in_RDI->_fs;
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_ffffffffffffff60,
                     (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50,
                     (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                     (SQInteger)in_stack_ffffffffffffff38);
        }
        (in_RDI->_es).etype = 1;
        Lex(in_stack_ffffffffffffff30);
        FunctionCallArgs(in_stack_ffffffffffffff60,SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0)
                        );
      }
      if (lVar1 != 0x2e) break;
      pSVar3 = (SQCompiler *)0xffffffffffffffff;
      Lex(in_stack_ffffffffffffff30);
      SQFuncState::PushTarget
                ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
      Expect((SQCompiler *)in_stack_ffffffffffffffd8.pTable,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      SQFuncState::GetConstant(in_stack_ffffffffffffff90,(SQObject *)in_RDI);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_ffffffffffffff60,
                 (SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50,
                 (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)in_stack_ffffffffffffff38);
      if ((in_RDI->_es).etype == 3) {
        Emit2ArgsOP(in_stack_ffffffffffffff60,(SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                    in_stack_ffffffffffffff50);
        pSVar3 = (SQCompiler *)SQFuncState::TopTarget((SQFuncState *)0x11a14b);
        (in_RDI->_es).etype = 1;
        (in_RDI->_es).epos = (SQInteger)pSVar3;
      }
      else {
        bVar2 = NeedGet(in_stack_ffffffffffffff38);
        if (bVar2) {
          Emit2ArgsOP(in_stack_ffffffffffffff60,(SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                      ,in_stack_ffffffffffffff50);
        }
        (in_RDI->_es).etype = 2;
      }
    }
    if (lVar1 != 0x5b) break;
    if ((in_RDI->_lex)._prevtoken == 10) {
      Error(in_RDI,"cannot brake deref/or comma needed after [exp]=exp slot declaration");
    }
    Lex(in_stack_ffffffffffffff30);
    Expression(pSVar3);
    SVar4 = Expect((SQCompiler *)in_stack_ffffffffffffffd8.pTable,
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    in_stack_ffffffffffffffd8 = SVar4._unVal;
    in_stack_ffffffffffffffd0 = SVar4._type;
    pSVar3 = (SQCompiler *)0xffffffffffffffff;
    if ((in_RDI->_es).etype == 3) {
      Emit2ArgsOP(in_stack_ffffffffffffff60,(SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                  in_stack_ffffffffffffff50);
      pSVar3 = (SQCompiler *)SQFuncState::TopTarget((SQFuncState *)0x11a23e);
      (in_RDI->_es).etype = 1;
      (in_RDI->_es).epos = (SQInteger)pSVar3;
    }
    else {
      bVar2 = NeedGet(in_stack_ffffffffffffff38);
      if (bVar2) {
        Emit2ArgsOP(in_stack_ffffffffffffff60,(SQOpcode)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                    in_stack_ffffffffffffff50);
      }
      (in_RDI->_es).etype = 2;
    }
  }
  if ((lVar1 - 0x12fU < 2) && (bVar2 = IsEndOfStatement(in_RDI), !bVar2)) {
    Lex(in_stack_ffffffffffffff30);
    pSVar3 = (SQCompiler *)((in_RDI->_es).etype + -1);
    switch(pSVar3) {
    case (SQCompiler *)0x0:
      Error(in_RDI,"can\'t \'++\' or \'--\' an expression");
      break;
    case (SQCompiler *)0x1:
    case (SQCompiler *)0x2:
      if (((in_RDI->_es).donot_get & 1U) == 1) {
        Error(in_RDI,"can\'t \'++\' or \'--\' an expression");
      }
      else {
        Emit2ArgsOP(pSVar3,SVar5,in_stack_ffffffffffffff50);
      }
      break;
    case (SQCompiler *)0x3:
      SQFuncState::PopTarget(in_stack_ffffffffffffff40);
      SVar5 = (SQOpcode)((ulong)in_RDI->_fs >> 0x20);
      SQFuncState::PushTarget
                ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
      SQFuncState::AddInstruction
                ((SQFuncState *)pSVar3,SVar5,in_stack_ffffffffffffff50,
                 (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)in_stack_ffffffffffffff38);
      break;
    case (SQCompiler *)0x4:
      SQFuncState::PushTarget
                ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
      SQFuncState::PushTarget
                ((SQFuncState *)in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30);
      SQFuncState::AddInstruction
                ((SQFuncState *)pSVar3,SVar5,in_stack_ffffffffffffff50,
                 (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)in_stack_ffffffffffffff38);
      SQFuncState::AddInstruction
                ((SQFuncState *)pSVar3,SVar5,in_stack_ffffffffffffff50,
                 (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)in_stack_ffffffffffffff38);
      SQFuncState::AddInstruction
                ((SQFuncState *)pSVar3,SVar5,in_stack_ffffffffffffff50,
                 (SQInteger)in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                 (SQInteger)in_stack_ffffffffffffff38);
      SQFuncState::PopTarget(in_stack_ffffffffffffff40);
    }
  }
  return;
}

Assistant:

void PrefixedExpr()
    {
        SQInteger pos = Factor();
        for(;;) {
            switch(_token) {
            case _SC('.'):
                pos = -1;
                Lex();

                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case _SC('['):
                if(_lex._prevtoken == _SC('\n')) Error(_SC("cannot brake deref/or comma needed after [exp]=exp slot declaration"));
                Lex(); Expression(); Expect(_SC(']'));
                pos = -1;
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case TK_MINUSMINUS:
            case TK_PLUSPLUS:
                {
                    if(IsEndOfStatement()) return;
                    SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                    Lex();
                    switch(_es.etype)
                    {
                        case EXPR: Error(_SC("can't '++' or '--' an expression")); break;
                        case OBJECT:
                        case BASE:
                            if(_es.donot_get == true)  { Error(_SC("can't '++' or '--' an expression")); break; } //mmh dor this make sense?
                            Emit2ArgsOP(_OP_PINC, diff);
                            break;
                        case LOCAL: {
                            SQInteger src = _fs->PopTarget();
                            _fs->AddInstruction(_OP_PINCL, _fs->PushTarget(), src, 0, diff);
                                    }
                            break;
                        case OUTER: {
                            SQInteger tmp1 = _fs->PushTarget();
                            SQInteger tmp2 = _fs->PushTarget();
                            _fs->AddInstruction(_OP_GETOUTER, tmp2, _es.epos);
                            _fs->AddInstruction(_OP_PINCL,    tmp1, tmp2, 0, diff);
                            _fs->AddInstruction(_OP_SETOUTER, tmp2, _es.epos, tmp2);
                            _fs->PopTarget();
                        }
                    }
                }
                return;
                break;
            case _SC('('):
                switch(_es.etype) {
                    case OBJECT: {
                        SQInteger key     = _fs->PopTarget();  /* location of the key */
                        SQInteger table   = _fs->PopTarget();  /* location of the object */
                        SQInteger closure = _fs->PushTarget(); /* location for the closure */
                        SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
                        _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
                        }
                        break;
                    case BASE:
                        //Emit2ArgsOP(_OP_GET);
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                        break;
                    case OUTER:
                        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), _es.epos);
                        _fs->AddInstruction(_OP_MOVE,     _fs->PushTarget(), 0);
                        break;
                    default:
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                }
                _es.etype = EXPR;
                Lex();
                FunctionCallArgs();
                break;
            default: return;
            }
        }
    }